

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

void __thiscall GEO::Delaunay3dThread::wait_for_event(Delaunay3dThread *this,index_t t)

{
  pthread_mutex_t *__mutex;
  Thread *pTVar1;
  
  pTVar1 = (this->master_->threads_).
           super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
           ._M_impl.super__Vector_impl_data._M_start[t].pointer_;
  __mutex = (pthread_mutex_t *)(pTVar1 + 0x15);
  pthread_mutex_lock(__mutex);
  if (*(char *)&pTVar1[0xe].super_Counted._vptr_Counted == '\0') {
    pthread_cond_wait((pthread_cond_t *)(pTVar1 + 0x12),__mutex);
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

Delaunay3dThread* thread(index_t t) {
            return static_cast<Delaunay3dThread*>(
                master_->threads_[t].get()
            );
        }